

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_session.c
# Opt level: O0

ssize_t dlep_session_process_signal(dlep_session *session,void *ptr,size_t length,_Bool is_udp)

{
  oonf_log_source oVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  dlep_parser_error dVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 in_stack_fffffffffffffed0;
  undefined4 uVar7;
  undefined8 in_stack_fffffffffffffed8;
  undefined4 uVar8;
  undefined1 local_e6 [8];
  netaddr_str nbuf;
  uint8_t *buffer;
  dlep_signals local_98;
  uint16_t signal_length;
  int32_t signal_type;
  uint16_t original_signal_type;
  dlep_parser_error result;
  _Bool is_udp_local;
  size_t length_local;
  void *ptr_local;
  dlep_session *session_local;
  
  uVar8 = (undefined4)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  uVar7 = (undefined4)((ulong)in_stack_fffffffffffffed0 >> 0x20);
  session->next_restrict_signal = DLEP_KEEP_RESTRICTION;
  if (length < 4) {
    if (((&log_global_mask)[session->log_source] & 1) != 0) {
      oVar1 = session->log_source;
      uVar5 = netaddr_socket_to_string(local_e6,&session->remote_socket);
      oonf_log(1,oVar1,"src/generic/dlep/dlep_session.c",0x186,0,0,
               "Not enough data to process signal from %s (%zu bytes)",uVar5,length);
    }
    session_local = (dlep_session *)0x0;
  }
  else {
    uVar3 = *(uint16_t *)((long)ptr + 2);
    nbuf.buf._54_8_ = ptr;
    uVar2 = ntohs(*ptr);
    local_98 = (dlep_signals)uVar2;
    uVar3 = ntohs(uVar3);
    uVar5 = nbuf.buf._54_8_;
    if (is_udp) {
      local_98 = local_98 + DLEP_IS_UDP_SIGNAL;
    }
    if (length < (ulong)uVar3 + 4) {
      if (((&log_global_mask)[session->log_source] & 1) != 0) {
        oVar1 = session->log_source;
        uVar5 = netaddr_socket_to_string(local_e6,&session->remote_socket);
        oonf_log(1,oVar1,"src/generic/dlep/dlep_session.c",0x19d,0,0,
                 "Not enough data to process signal %u (length %u) from %s (%zu bytes)",
                 CONCAT44(uVar7,local_98),CONCAT44(uVar8,(uint)uVar3),uVar5,length);
      }
      session_local = (dlep_session *)0x0;
    }
    else {
      if (((&log_global_mask)[session->log_source] & 1) != 0) {
        oVar1 = session->log_source;
        uVar6 = netaddr_socket_to_string(local_e6,&session->remote_socket);
        oonf_log(1,oVar1,"src/generic/dlep/dlep_session.c",0x1a3,uVar5,uVar3 + 4,
                 "Process signal %d from %s (%zu bytes)",CONCAT44(uVar7,local_98),uVar6,length);
      }
      if ((session->restrict_signal == DLEP_ALL_SIGNALS) || (session->restrict_signal == local_98))
      {
        dVar4 = _process_tlvs(session,local_98,uVar3,(uint8_t *)(nbuf.buf._54_8_ + 4));
        if (dVar4 == DLEP_NEW_PARSER_TERMINDATED) {
          session_local = (dlep_session *)0xffffffffffffffff;
        }
        else {
          if (dVar4 == DLEP_NEW_PARSER_OKAY) {
            if (session->next_restrict_signal != DLEP_KEEP_RESTRICTION) {
              session->restrict_signal = session->next_restrict_signal;
            }
          }
          else {
            if (((&log_global_mask)[session->log_source] & 4) != 0) {
              oonf_log(4,session->log_source,"src/generic/dlep/dlep_session.c",0x1b5,0,0,
                       "Parser error: %d",dVar4);
            }
            _send_terminate(session,DLEP_STATUS_INVALID_DATA,"Incoming signal could not be parsed");
          }
          session_local = (dlep_session *)(long)(int)(uVar3 + 4);
        }
      }
      else {
        if (((&log_global_mask)[session->log_source] & 1) != 0) {
          oonf_log(1,session->log_source,"src/generic/dlep/dlep_session.c",0x1a9,0,0,
                   "Signal should have been %d, drop session",session->restrict_signal);
        }
        session_local = (dlep_session *)0xffffffffffffffff;
      }
    }
  }
  return (ssize_t)session_local;
}

Assistant:

ssize_t
dlep_session_process_signal(struct dlep_session *session, const void *ptr, size_t length, bool is_udp) {
  enum dlep_parser_error result;
  uint16_t original_signal_type;
  int32_t signal_type;
  uint16_t signal_length;
  const uint8_t *buffer;
#ifdef OONF_LOG_DEBUG_INFO
  struct netaddr_str nbuf;
#endif

  session->next_restrict_signal = DLEP_KEEP_RESTRICTION;

  if (length < 4) {
    /* not enough data for a signal type */
    OONF_DEBUG(session->log_source,
      "Not enough data to process"
      " signal from %s (%" PRINTF_SIZE_T_SPECIFIER " bytes)",
      netaddr_socket_to_string(&nbuf, &session->remote_socket), length);

    return 0;
  }

  buffer = ptr;

  /* copy data */
  memcpy(&original_signal_type, &buffer[0], sizeof(original_signal_type));
  memcpy(&signal_length, &buffer[2], sizeof(signal_length));
  signal_type = ntohs(original_signal_type);
  signal_length = ntohs(signal_length);

  if (is_udp) {
    signal_type += DLEP_IS_UDP_SIGNAL;
  }

  if (length < (size_t)signal_length + 4u) {
    /* not enough data for signal */
    OONF_DEBUG(session->log_source,
      "Not enough data to process"
      " signal %u (length %u) from %s"
      " (%" PRINTF_SIZE_T_SPECIFIER " bytes)",
      signal_type, signal_length, netaddr_socket_to_string(&nbuf, &session->remote_socket), length);
    return 0;
  }

  OONF_DEBUG_HEX(session->log_source, buffer, signal_length + 4,
    "Process signal %d from %s (%" PRINTF_SIZE_T_SPECIFIER " bytes)", signal_type,
    netaddr_socket_to_string(&nbuf, &session->remote_socket), length);

  if (session->restrict_signal != DLEP_ALL_SIGNALS && session->restrict_signal != signal_type) {
    OONF_DEBUG(session->log_source,
      "Signal should have been %d,"
      " drop session",
      session->restrict_signal);
    /* we only accept a single type and we got the wrong one */
    return -1;
  }

  result = _process_tlvs(session, signal_type, signal_length, &buffer[4]);

  if (result == DLEP_NEW_PARSER_TERMINDATED) {
    /* session is now invalid, end parser */
    return result;
  }
  if (result != DLEP_NEW_PARSER_OKAY) {
    OONF_WARN(session->log_source, "Parser error: %d", result);
    _send_terminate(session, DLEP_STATUS_INVALID_DATA, "Incoming signal could not be parsed");
  }
  else if (session->next_restrict_signal != DLEP_KEEP_RESTRICTION) {
    session->restrict_signal = session->next_restrict_signal;
  }

  /* skip forward */
  return signal_length + 4;
}